

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O0

void unpackforblock4(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  uint32_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint64_t w1;
  uint64_t w0;
  uint64_t mask;
  uint32_t *out;
  uint64_t *pw64;
  uint32_t **pout_local;
  uint8_t **pw_local;
  uint32_t base_local;
  
  puVar1 = *pout;
  uVar2 = *(ulong *)*pw;
  uVar3 = *(ulong *)((long)*pw + 8);
  *pw = *pw + 0x10;
  *puVar1 = base + ((uint)uVar2 & 0xf);
  puVar1[1] = base + ((uint)(uVar2 >> 4) & 0xf);
  puVar1[2] = base + ((uint)(uVar2 >> 8) & 0xf);
  puVar1[3] = base + ((uint)(uVar2 >> 0xc) & 0xf);
  puVar1[4] = base + ((uint)(uVar2 >> 0x10) & 0xf);
  puVar1[5] = base + ((uint)(uVar2 >> 0x14) & 0xf);
  puVar1[6] = base + ((uint)(uVar2 >> 0x18) & 0xf);
  puVar1[7] = base + ((uint)(uVar2 >> 0x1c) & 0xf);
  uVar4 = (uint)(uVar2 >> 0x20);
  puVar1[8] = base + (uVar4 & 0xf);
  puVar1[9] = base + (uVar4 >> 4 & 0xf);
  puVar1[10] = base + (uVar4 >> 8 & 0xf);
  puVar1[0xb] = base + (uVar4 >> 0xc & 0xf);
  puVar1[0xc] = base + ((ushort)(uVar2 >> 0x30) & 0xf);
  puVar1[0xd] = base + (uVar4 >> 0x14 & 0xf);
  puVar1[0xe] = base + ((byte)(uVar2 >> 0x38) & 0xf);
  puVar1[0xf] = base + (uVar4 >> 0x1c);
  puVar1[0x10] = base + ((uint)uVar3 & 0xf);
  puVar1[0x11] = base + ((uint)(uVar3 >> 4) & 0xf);
  puVar1[0x12] = base + ((uint)(uVar3 >> 8) & 0xf);
  puVar1[0x13] = base + ((uint)(uVar3 >> 0xc) & 0xf);
  puVar1[0x14] = base + ((uint)(uVar3 >> 0x10) & 0xf);
  puVar1[0x15] = base + ((uint)(uVar3 >> 0x14) & 0xf);
  puVar1[0x16] = base + ((uint)(uVar3 >> 0x18) & 0xf);
  puVar1[0x17] = base + ((uint)(uVar3 >> 0x1c) & 0xf);
  uVar4 = (uint)(uVar3 >> 0x20);
  puVar1[0x18] = base + (uVar4 & 0xf);
  puVar1[0x19] = base + (uVar4 >> 4 & 0xf);
  puVar1[0x1a] = base + (uVar4 >> 8 & 0xf);
  puVar1[0x1b] = base + (uVar4 >> 0xc & 0xf);
  puVar1[0x1c] = base + ((ushort)(uVar3 >> 0x30) & 0xf);
  puVar1[0x1d] = base + (uVar4 >> 0x14 & 0xf);
  puVar1[0x1e] = base + ((byte)(uVar3 >> 0x38) & 0xf);
  puVar1[0x1f] = base + (uVar4 >> 0x1c);
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock4(const uint32_t base, const uint8_t **pw,
                            uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(15);
  /* we are going to access  2 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  *pw += 16; /* we used up 16 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 4) & mask);
  out[2] = base + (uint32_t)((w0 >> 8) & mask);
  out[3] = base + (uint32_t)((w0 >> 12) & mask);
  out[4] = base + (uint32_t)((w0 >> 16) & mask);
  out[5] = base + (uint32_t)((w0 >> 20) & mask);
  out[6] = base + (uint32_t)((w0 >> 24) & mask);
  out[7] = base + (uint32_t)((w0 >> 28) & mask);
  out[8] = base + (uint32_t)((w0 >> 32) & mask);
  out[9] = base + (uint32_t)((w0 >> 36) & mask);
  out[10] = base + (uint32_t)((w0 >> 40) & mask);
  out[11] = base + (uint32_t)((w0 >> 44) & mask);
  out[12] = base + (uint32_t)((w0 >> 48) & mask);
  out[13] = base + (uint32_t)((w0 >> 52) & mask);
  out[14] = base + (uint32_t)((w0 >> 56) & mask);
  out[15] = base + (uint32_t)(w0 >> 60);
  out[16] = base + (uint32_t)((w1)&mask);
  out[17] = base + (uint32_t)((w1 >> 4) & mask);
  out[18] = base + (uint32_t)((w1 >> 8) & mask);
  out[19] = base + (uint32_t)((w1 >> 12) & mask);
  out[20] = base + (uint32_t)((w1 >> 16) & mask);
  out[21] = base + (uint32_t)((w1 >> 20) & mask);
  out[22] = base + (uint32_t)((w1 >> 24) & mask);
  out[23] = base + (uint32_t)((w1 >> 28) & mask);
  out[24] = base + (uint32_t)((w1 >> 32) & mask);
  out[25] = base + (uint32_t)((w1 >> 36) & mask);
  out[26] = base + (uint32_t)((w1 >> 40) & mask);
  out[27] = base + (uint32_t)((w1 >> 44) & mask);
  out[28] = base + (uint32_t)((w1 >> 48) & mask);
  out[29] = base + (uint32_t)((w1 >> 52) & mask);
  out[30] = base + (uint32_t)((w1 >> 56) & mask);
  out[31] = base + (uint32_t)(w1 >> 60);
  *pout += 32; /* we wrote 32 32-bit integers */
}